

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void DC16NoLeft_C(uint8_t *dst)

{
  long in_RDI;
  int i;
  int DC;
  uint8_t *in_stack_ffffffffffffffe8;
  undefined4 local_10;
  int v;
  
  v = 8;
  for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
    v = (uint)*(byte *)(in_RDI + (local_10 + -0x20)) + v;
  }
  Put16(v,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void DC16NoLeft_C(uint8_t* dst) {  // DC with left samples not available
  int DC = 8;
  int i;
  for (i = 0; i < 16; ++i) {
    DC += dst[i - BPS];
  }
  Put16(DC >> 4, dst);
}